

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::Maybe<capnp::MessageReaderAndFds>::Maybe
          (Maybe<capnp::MessageReaderAndFds> *this,Maybe<capnp::MessageReaderAndFds> *other)

{
  bool bVar1;
  MessageReader *pMVar2;
  Disposer *pDVar3;
  size_t sVar4;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = bVar1;
  if (bVar1 == true) {
    (this->ptr).field_1.value.reader.disposer = (other->ptr).field_1.value.reader.disposer;
    (this->ptr).field_1.value.reader.ptr = (other->ptr).field_1.value.reader.ptr;
    (other->ptr).field_1.value.reader.ptr = (MessageReader *)0x0;
    sVar4 = (other->ptr).field_1.value.fds.size_;
    (this->ptr).field_1.value.fds.ptr = (other->ptr).field_1.value.fds.ptr;
    (this->ptr).field_1.value.fds.size_ = sVar4;
  }
  if ((other->ptr).isSet == true) {
    (other->ptr).isSet = false;
    pMVar2 = (other->ptr).field_1.value.reader.ptr;
    if (pMVar2 != (MessageReader *)0x0) {
      (other->ptr).field_1.value.reader.ptr = (MessageReader *)0x0;
      pDVar3 = (other->ptr).field_1.value.reader.disposer;
      (**pDVar3->_vptr_Disposer)
                (pDVar3,(code *)((long)pMVar2->arenaSpace +
                                (long)(pMVar2->_vptr_MessageReader[-2] + -0x18)));
    }
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }